

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManPrintMappingStats(Gia_Man_t *p,char *pDumpFile)

{
  undefined8 uVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *__ptr;
  Gia_Obj_t *pGVar8;
  int *piVar9;
  FILE *__stream;
  abctime aVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint local_68;
  ulong local_60;
  ulong local_58;
  int pFanins [3];
  
  if (p->vMapping != (Vec_Int_t *)0x0) {
    iVar3 = p->nObjs;
    __ptr = calloc((long)iVar3,4);
    local_58 = 0;
    lVar15 = 1;
    uVar12 = 0;
    local_60 = 0;
    local_68 = 0;
    iVar14 = 0;
    while( true ) {
      iVar11 = (int)lVar15;
      iVar2 = (int)local_60;
      if (iVar3 <= lVar15) break;
      iVar3 = Gia_ObjIsLut(p,iVar11);
      if (iVar3 != 0) {
        iVar3 = Gia_ObjLutIsMux(p,iVar11);
        if (iVar3 == 0) {
          iVar3 = Gia_ObjLutSize(p,iVar11);
          uVar5 = Gia_ObjLutSize(p,iVar11);
          for (lVar13 = 0; iVar6 = Gia_ObjLutSize(p,iVar11), lVar13 < iVar6; lVar13 = lVar13 + 1) {
            piVar9 = Gia_ObjLutFanins(p,iVar11);
            iVar6 = *(int *)((long)__ptr + lVar15 * 4);
            iVar7 = *(int *)((long)__ptr + (long)piVar9[lVar13] * 4);
            if (iVar7 < iVar6) {
              iVar7 = iVar6;
            }
            *(int *)((long)__ptr + lVar15 * 4) = iVar7;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          local_60 = (ulong)(uint)(iVar2 + iVar3);
          if ((int)local_58 <= (int)uVar5) {
            local_58 = (ulong)uVar5;
          }
          uVar5 = *(int *)((long)__ptr + lVar15 * 4) + 1;
          *(uint *)((long)__ptr + lVar15 * 4) = uVar5;
          if ((int)local_68 <= (int)uVar5) {
            local_68 = uVar5;
          }
        }
        else {
          iVar3 = Gia_ObjLutSize(p,iVar11);
          if (iVar3 == 3) {
            pGVar8 = Gia_ManObj(p,iVar11);
            Gia_ManPrintGetMuxFanins(p,pGVar8,pFanins);
            uVar5 = *(uint *)((long)__ptr + lVar15 * 4);
            uVar4 = *(int *)((long)__ptr + (long)pFanins[0] * 4) + 1;
            if ((int)uVar4 < (int)uVar5) {
              uVar4 = uVar5;
            }
            *(uint *)((long)__ptr + lVar15 * 4) = uVar4;
            uVar5 = *(uint *)((long)__ptr + (long)pFanins[1] * 4);
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            *(uint *)((long)__ptr + lVar15 * 4) = uVar4;
            iVar11 = pFanins[2];
LAB_001f1629:
            uVar5 = *(uint *)((long)__ptr + (long)iVar11 * 4);
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            *(uint *)((long)__ptr + lVar15 * 4) = uVar4;
          }
          else {
            iVar3 = Gia_ObjLutSize(p,iVar11);
            if (iVar3 == 2) {
              pGVar8 = Gia_ManObj(p,iVar11);
              uVar5 = *(uint *)((long)__ptr + lVar15 * 4);
              uVar1 = *(undefined8 *)pGVar8;
              uVar4 = *(uint *)((long)__ptr + (long)(int)(iVar11 - ((uint)uVar1 & 0x1fffffff)) * 4);
              if ((int)uVar4 < (int)uVar5) {
                uVar4 = uVar5;
              }
              *(uint *)((long)__ptr + lVar15 * 4) = uVar4;
              iVar11 = iVar11 - ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff);
              goto LAB_001f1629;
            }
            uVar4 = *(uint *)((long)__ptr + lVar15 * 4);
          }
          if ((int)local_68 <= (int)uVar4) {
            local_68 = uVar4;
          }
          local_60 = (ulong)(iVar2 + 1);
          iVar14 = iVar14 + 1;
        }
      }
      lVar15 = lVar15 + 1;
      iVar3 = p->nObjs;
    }
    iVar11 = 0;
    iVar3 = 0;
    while ((iVar11 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar11), pGVar8 != (Gia_Obj_t *)0x0)))
    {
      iVar6 = Gia_ObjFaninId0p(p,pGVar8);
      iVar3 = iVar3 + *(int *)((long)__ptr + (long)iVar6 * 4);
      iVar11 = iVar11 + 1;
    }
    free(__ptr);
    Abc_Print(1,"Mapping (K=%d)  :  ",local_58);
    Abc_Print(1,"%slut =%7d%s  ","\x1b[1;33m",uVar12,"\x1b[0m");
    Abc_Print(1,"%sedge =%8d%s  ","\x1b[1;32m",local_60,"\x1b[0m");
    Abc_Print(1,"%slev =%5d%s ","\x1b[1;31m",(ulong)local_68,"\x1b[0m");
    Abc_Print(1,"%s(%.2f)%s  ",(double)((float)iVar3 / (float)p->vCos->nSize),"\x1b[1;31m","\x1b[0m"
             );
    if (((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) &&
       (iVar3 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar3 != 0)) {
      uVar5 = Gia_ManLutLevelWithBoxes(p);
      Abc_Print(1,"%slevB =%5d%s  ","\x1b[1;31m",(ulong)uVar5,"\x1b[0m");
    }
    Abc_Print(1,"mem =%5.2f MB",
              (double)(iVar2 + (int)uVar12 * 2 + p->nObjs) * 4.0 * 9.5367431640625e-07);
    Abc_Print(1,"\n");
    if (iVar14 != 0) {
      Gia_ManCountDupLut(p);
    }
    if (pDumpFile != (char *)0x0) {
      __stream = fopen(pDumpFile,"a+");
      __s2 = p->pName;
      iVar3 = strcmp(Gia_ManPrintMappingStats::FileNameOld,__s2);
      if (iVar3 == 0) {
        fputc(0x20,__stream);
        fprintf(__stream,"%d ",uVar12);
        uVar5 = Gia_ManLutLevelWithBoxes(p);
        fprintf(__stream,"%d ",(ulong)uVar5);
        aVar10 = Abc_Clock();
        fprintf(__stream,"%.2f",(double)(aVar10 - Gia_ManPrintMappingStats::clk) / 1000000.0);
      }
      else {
        strcpy(Gia_ManPrintMappingStats::FileNameOld,__s2);
        fputc(10,__stream);
        fprintf(__stream,"%s ",p->pName);
        fputc(0x20,__stream);
        uVar5 = Gia_ManAndNum(p);
        fprintf(__stream,"%d ",(ulong)uVar5);
        fprintf(__stream,"%d ",uVar12);
        uVar5 = Gia_ManLutLevelWithBoxes(p);
        fprintf(__stream,"%d ",(ulong)uVar5);
      }
      Gia_ManPrintMappingStats::clk = Abc_Clock();
      fclose(__stream);
      return;
    }
  }
  return;
}

Assistant:

void Gia_ManPrintMappingStats( Gia_Man_t * p, char * pDumpFile )
{
    Gia_Obj_t * pObj;
    int * pLevels;
    int i, k, iFan, nLutSize = 0, nLuts = 0, nFanins = 0, LevelMax = 0, Ave = 0, nMuxF = 0;
    if ( !Gia_ManHasMapping(p) )
        return;
    pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutIsMux(p, i) )
        {
            int pFanins[3];
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, Gia_ManObj(p, i), pFanins );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[0]]+1 );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[1]] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[2]] );
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pObj = Gia_ManObj( p, i );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId0(pObj, i)] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId1(pObj, i)] );
            }
            LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
            nFanins++;
            nMuxF++;
            continue;
        }
        nLuts++;
        nFanins += Gia_ObjLutSize(p, i);
        nLutSize = Abc_MaxInt( nLutSize, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
        pLevels[i]++;
        LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
    }
    Gia_ManForEachCo( p, pObj, i )
        Ave += pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );

#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    SetConsoleTextAttribute( hConsole, 14 ); // yellow
    Abc_Print( 1, "lut =%7d  ",  nLuts );
    if ( nMuxF )
    Abc_Print( 1, "muxF =%7d  ",  nMuxF );
    SetConsoleTextAttribute( hConsole, 10 ); // green
    Abc_Print( 1, "edge =%8d  ", nFanins );
    SetConsoleTextAttribute( hConsole, 12 ); // red
    Abc_Print( 1, "lev =%5d ",   LevelMax );
    Abc_Print( 1, "(%.2f)  ",    (float)Ave / Gia_ManCoNum(p) );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "levB =%5d  ", Gia_ManLutLevelWithBoxes(p) );
    SetConsoleTextAttribute( hConsole, 7 );  // normal
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
    }
#else
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    Abc_Print( 1, "%slut =%7d%s  ",  "\033[1;33m", nLuts,    "\033[0m" );  // yellow
    Abc_Print( 1, "%sedge =%8d%s  ", "\033[1;32m", nFanins,  "\033[0m" );  // green
    Abc_Print( 1, "%slev =%5d%s ",   "\033[1;31m", LevelMax, "\033[0m" );  // red
    Abc_Print( 1, "%s(%.2f)%s  ",    "\033[1;31m", (float)Ave / Gia_ManCoNum(p), "\033[0m" );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "%slevB =%5d%s  ", "\033[1;31m", Gia_ManLutLevelWithBoxes(p), "\033[0m" );
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
#endif

    if ( nMuxF )
        Gia_ManCountDupLut( p );

    //return;
    if ( pDumpFile )
    {
        static char FileNameOld[1000] = {0};
        static abctime clk = 0;
        FILE * pTable = fopen( pDumpFile, "a+" );
        if ( strcmp( FileNameOld, p->pName ) )
        {
            sprintf( FileNameOld, "%s", p->pName );
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", Gia_ManAndNum(p) );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            //fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        else
        {
            //printf( "This part of the code is currently not used.\n" );
            //assert( 0 );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        fclose( pTable );
    }

}